

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcFaceBasedSurfaceModel::~IfcFaceBasedSurfaceModel
          (IfcFaceBasedSurfaceModel *this)

{
  void *pvVar1;
  
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFaceBasedSurfaceModel_00896e40;
  *(undefined ***)&this->field_0x48 = &PTR__IfcFaceBasedSurfaceModel_00896eb8;
  *(undefined ***)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcFaceBasedSurfaceModel_00896e68;
  *(undefined ***)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcFaceBasedSurfaceModel_00896e90;
  pvVar1 = *(void **)&(this->super_IfcGeometricRepresentationItem).field_0x30;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this->field_0x40 - (long)pvVar1);
  }
  operator_delete(this,0x60);
  return;
}

Assistant:

IfcFaceBasedSurfaceModel() : Object("IfcFaceBasedSurfaceModel") {}